

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O3

void poptSetExecPath(poptContext con,char *path,int allowAbsolute)

{
  size_t sVar1;
  char *pcVar2;
  poptContext con_00;
  poptArgv ppcVar3;
  poptOption *opt;
  poptOption *in_RCX;
  uint uVar4;
  poptArgv extraout_RDX;
  int iVar5;
  char *pcVar6;
  long *plVar7;
  poptContext con_01;
  ulong in_R8;
  undefined8 in_R9;
  ulong uVar8;
  undefined8 uVar9;
  
  pcVar6 = path;
  if (con->execPath != (char *)0x0) {
    free(con->execPath);
  }
  iVar5 = (int)pcVar6;
  con->execPath = (char *)0x0;
  sVar1 = strlen(path);
  pcVar6 = (char *)(sVar1 + 1);
  pcVar2 = (char *)malloc((size_t)pcVar6);
  if (pcVar2 == (char *)0x0) {
    poptSetExecPath_cold_1();
    con_00 = (poptContext)calloc(1,800);
    if (con_00 != (poptContext)0x0) {
      con_00->os = (optionStackEntry *)con_00;
      con_00->optionStack[0].argc = iVar5;
      con_00->optionStack[0].argv = extraout_RDX;
      if ((in_R8 & 2) == 0) {
        con_00->optionStack[0].next = 1;
      }
      ppcVar3 = (poptArgv)calloc((long)(iVar5 + 1),8);
      con_00->leftovers = ppcVar3;
      con_00->allocLeftovers = iVar5 + 1;
      con_00->options = in_RCX;
      con_00->aliases = (poptItem)0x0;
      con_00->numAliases = 0;
      con_00->flags = (uint)in_R8;
      con_00->execs = (poptItem)0x0;
      con_00->numExecs = 0;
      con_00->execFail = (char *)0x0;
      uVar4 = iVar5 * 2;
      uVar8 = (ulong)uVar4;
      con_00->finalArgvAlloced = uVar4;
      plVar7 = (long *)0x8;
      ppcVar3 = (poptArgv)calloc((long)(int)uVar4,8);
      con_00->finalArgv = ppcVar3;
      con_00->execAbsolute = 1;
      con_00->arg_strip = (pbm_set *)0x0;
      pcVar2 = getenv("POSIXLY_CORRECT");
      if ((pcVar2 != (char *)0x0) || (pcVar2 = getenv("POSIX_ME_HARDER"), pcVar2 != (char *)0x0)) {
        con_00->flags = (uint)in_R8 | 4;
      }
      if (pcVar6 != (char *)0x0) {
        sVar1 = strlen(pcVar6);
        con_01 = (poptContext)(sVar1 + 1);
        pcVar2 = (char *)malloc((size_t)con_01);
        if (pcVar2 == (char *)0x0) {
          poptGetContext_cold_1();
          if (plVar7 != (long *)0x0) {
            uVar9 = 0;
            for (; ((*plVar7 != 0 || ((char)plVar7[1] != '\0')) || (plVar7[2] != 0));
                plVar7 = plVar7 + 6) {
              opt = (poptOption *)plVar7[2];
              if (opt != (poptOption *)0x0) {
                uVar4 = _poptArgMask & *(uint *)((long)plVar7 + 0xc);
                if (uVar4 == 5) {
                  if ((int)*(uint *)((long)plVar7 + 0xc) < 0) {
                    (*(code *)opt)(con_01,0,0,0,plVar7[4],in_R9,in_RCX,uVar8,uVar9,con_00,pcVar6);
                  }
                }
                else if (uVar4 == 4) {
                  if (opt == poptHelpOptions) {
                    opt = poptHelpOptionsI18N;
                  }
                  invokeCallbacksPRE(con_01,opt);
                }
              }
            }
          }
          return;
        }
        strcpy(pcVar2,pcVar6);
        con_00->appName = pcVar2;
      }
      invokeCallbacksPRE(con_00,in_RCX);
    }
    return;
  }
  strcpy(pcVar2,path);
  con->execPath = pcVar2;
  con->execAbsolute = allowAbsolute;
  return;
}

Assistant:

void poptSetExecPath(poptContext con, const char * path, int allowAbsolute)
{
    con->execPath = _free(con->execPath);
    con->execPath = xstrdup(path);
    con->execAbsolute = allowAbsolute;
    return;
}